

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash,xmlHashCopier copyFunc,xmlHashDeallocator deallocFunc)

{
  int iVar1;
  xmlHashTablePtr hash_00;
  void *payload;
  xmlHashEntry *pxVar2;
  xmlHashEntry *pxVar3;
  
  if ((copyFunc != (xmlHashCopier)0x0 && hash != (xmlHashTablePtr)0x0) &&
     (hash_00 = xmlHashCreate(hash->size), hash_00 != (xmlHashTablePtr)0x0)) {
    if ((ulong)hash->size == 0) {
      return hash_00;
    }
    pxVar3 = hash->table;
    pxVar2 = pxVar3 + hash->size;
    while( true ) {
      if (pxVar2 <= pxVar3) {
        return hash_00;
      }
      if (pxVar3->hashValue != 0) break;
LAB_00131b28:
      pxVar3 = pxVar3 + 1;
    }
    payload = (*copyFunc)(pxVar3->payload,pxVar3->key);
    if (payload != (void *)0x0) {
      iVar1 = xmlHashAdd3(hash_00,pxVar3->key,pxVar3->key2,pxVar3->key3,payload);
      if (0 < iVar1) goto LAB_00131b28;
      if (deallocFunc != (xmlHashDeallocator)0x0) {
        (*deallocFunc)(payload,pxVar3->key);
      }
    }
    xmlHashFree(hash_00,deallocFunc);
  }
  return (xmlHashTablePtr)0x0;
}

Assistant:

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash, xmlHashCopier copyFunc,
                xmlHashDeallocator deallocFunc) {
    const xmlHashEntry *entry, *end;
    xmlHashTablePtr ret;

    if ((hash == NULL) || (copyFunc == NULL))
        return(NULL);

    ret = xmlHashCreate(hash->size);
    if (ret == NULL)
        return(NULL);

    if (hash->size == 0)
        return(ret);

    end = &hash->table[hash->size];

    for (entry = hash->table; entry < end; entry++) {
        if (entry->hashValue != 0) {
            void *copy;

            copy = copyFunc(entry->payload, entry->key);
            if (copy == NULL)
                goto error;
            if (xmlHashAdd3(ret, entry->key, entry->key2, entry->key3,
                            copy) <= 0) {
                if (deallocFunc != NULL)
                    deallocFunc(copy, entry->key);
                goto error;
            }
        }
    }

    return(ret);

error:
    xmlHashFree(ret, deallocFunc);
    return(NULL);
}